

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reader.cpp
# Opt level: O0

int __thiscall ninx::lexer::Reader::ignore_spaces(Reader *this)

{
  int iVar1;
  int iVar2;
  int local_14;
  int current;
  int count;
  Reader *this_local;
  
  local_14 = 0;
  while( true ) {
    iVar1 = std::istream::peek();
    iVar2 = isspace(iVar1);
    if (iVar2 == 0 || iVar1 == 10) break;
    std::istream::get();
    local_14 = local_14 + 1;
  }
  return local_14;
}

Assistant:

int ninx::lexer::Reader::ignore_spaces() {
    int count = 0;
    int current;
    // Skip all the spaces except the newline
    while (isspace(current = this->stream.peek()) && current != '\n') {
        this->stream.get();
        count++;
    }
    return count;
}